

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O1

void __thiscall Psbt_SetTxInOnly_Test::TestBody(Psbt_SetTxInOnly_Test *this)

{
  bool bVar1;
  _func_int *message;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  TxInReference txin_r;
  TxIn txin_l;
  Psbt psbt;
  TxIn txin_w;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [16];
  AssertHelper local_240;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238 [2];
  AssertHelper local_228;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  undefined1 local_218 [144];
  AbstractTxIn local_188;
  Psbt local_f8 [80];
  AbstractTxIn local_a8;
  
  cfd::core::Psbt::Psbt(local_f8);
  local_188._vptr_AbstractTxIn = (_func_int **)((ulong)local_188._vptr_AbstractTxIn._4_4_ << 0x20);
  local_218._0_4_ = cfd::core::Psbt::GetTxInCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_a8,"0","psbt.GetTxInCount()",(int *)&local_188,(uint *)local_218);
  if ((char)local_a8._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (local_a8.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x44c2d3;
    }
    else {
      message = *local_a8.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x195,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if (local_188._vptr_AbstractTxIn != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_188._vptr_AbstractTxIn != (_func_int **)0x0)) {
        (**(code **)(*local_188._vptr_AbstractTxIn + 8))();
      }
      local_188._vptr_AbstractTxIn = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_218._0_8_ = (AssertHelperData *)(local_218 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,"c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26",
             "");
  cfd::core::Txid::Txid((Txid *)&local_188,(string *)local_218);
  cfd::core::TxIn::TxIn((TxIn *)&local_a8,(Txid *)&local_188,1,0xffffffff);
  local_188._vptr_AbstractTxIn = (_func_int **)&PTR__Txid_004deb78;
  if (local_188.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_188.txid_._vptr_Txid);
  }
  if ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_);
  }
  local_260.ptr_ = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_218,(string *)&local_260);
  cfd::core::TxIn::TxIn((TxIn *)&local_188,(Txid *)local_218,0,0xffffffff);
  local_218._0_8_ = &PTR__Txid_004deb78;
  if ((_func_int **)local_218._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_218._8_8_);
  }
  if (local_260.ptr_ != local_250) {
    operator_delete(local_260.ptr_);
  }
  cfd::core::TxInReference::TxInReference((TxInReference *)local_218,(TxIn *)&local_188);
  cfd::core::Psbt::AddTxIn((TxIn *)local_f8);
  cfd::core::Psbt::AddTxIn((TxInReference *)local_f8);
  local_240.data_._0_4_ = 2;
  local_228.data_._0_4_ = cfd::core::Psbt::GetTxInCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_260,"2","psbt.GetTxInCount()",(int *)&local_240,(uint *)&local_228);
  if (local_260.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_240);
    if (local_258.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_258.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x19b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_240.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_240.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_240.data_ + 8))();
      }
      local_240.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_228,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000"
             ,(char *)local_260.ptr_);
  if (local_260.ptr_ != local_250) {
    operator_delete(local_260.ptr_);
  }
  if (local_240.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_240.data_);
  }
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if (local_220.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x19d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260.ptr_ + 8))();
      }
      local_260.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_240,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,(char *)local_260.ptr_);
  if (local_260.ptr_ != local_250) {
    operator_delete(local_260.ptr_);
  }
  if (local_240.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if (local_238[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_238[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_psbt.cpp"
               ,0x19e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260.ptr_ + 8))();
      }
      local_260.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_218);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_188);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_a8);
  cfd::core::Psbt::~Psbt(local_f8);
  return;
}

Assistant:

TEST(Psbt, SetTxInOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxInCount());
  TxIn txin_w(Txid("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26"), 1, 0xffffffff);
  TxIn txin_l(Txid("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"), 0, 0xffffffff);
  TxInReference txin_r(txin_l);
  psbt.AddTxIn(txin_w);
  psbt.AddTxIn(txin_r);
  EXPECT_EQ(2, psbt.GetTxInCount());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==", psbt.GetBase64().c_str());
}